

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool duckdb::LogicalType::TryGetMaxLogicalType
               (ClientContext *context,LogicalType *left,LogicalType *right,LogicalType *result)

{
  bool bVar1;
  DBConfig *pDVar2;
  LogicalType LStack_38;
  
  pDVar2 = DBConfig::GetConfig(context);
  if ((pDVar2->options).old_implicit_casting == true) {
    ForceMaxLogicalType(&LStack_38,left,right);
    operator=(result,&LStack_38);
    ~LogicalType(&LStack_38);
    return true;
  }
  bVar1 = TryGetMaxLogicalTypeInternal<duckdb::TryGetTypeOperation>(left,right,result);
  return bVar1;
}

Assistant:

bool LogicalType::TryGetMaxLogicalType(ClientContext &context, const LogicalType &left, const LogicalType &right,
                                       LogicalType &result) {
	if (DBConfig::GetConfig(context).options.old_implicit_casting) {
		result = LogicalType::ForceMaxLogicalType(left, right);
		return true;
	}
	return TryGetMaxLogicalTypeInternal<TryGetTypeOperation>(left, right, result);
}